

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monmove.c
# Opt level: O3

boolean mb_trapped(monst *mtmp)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  
  if (flags.verbose != '\0') {
    if ((viz_array[mtmp->my][mtmp->mx] & 2U) == 0) {
      if (flags.soundok != '\0') {
        You_hear("a distant explosion.");
      }
    }
    else {
      pline("KABOOM!!  You see a door explode.");
    }
  }
  wake_nearto((int)mtmp->mx,(int)mtmp->my,0x31);
  mtmp->field_0x62 = mtmp->field_0x62 | 0x10;
  uVar2 = mt_random();
  iVar3 = ~(uVar2 % 0xf) + mtmp->mhp;
  mtmp->mhp = iVar3;
  if (iVar3 < 1) {
    mondied(mtmp);
    bVar1 = mtmp->mhp < 1;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

boolean mb_trapped(struct monst *mtmp)
{
	if (flags.verbose) {
	    if (cansee(mtmp->mx, mtmp->my))
		pline("KABOOM!!  You see a door explode.");
	    else if (flags.soundok)
		You_hear("a distant explosion.");
	}
	wake_nearto(mtmp->mx, mtmp->my, 7*7);
	mtmp->mstun = 1;
	mtmp->mhp -= rnd(15);
	if (mtmp->mhp <= 0) {
		mondied(mtmp);
		if (mtmp->mhp > 0) /* lifesaved */
			return FALSE;
		else
			return TRUE;
	}
	return FALSE;
}